

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key_seq_executor.cpp
# Opt level: O2

void __thiscall KeySequentialExecutor::startWorkers(KeySequentialExecutor *this)

{
  string *__return_storage_ptr__;
  __hashtable *__h;
  ulong uVar1;
  undefined1 local_60 [48];
  
  __return_storage_ptr__ = (string *)(local_60 + 0x10);
  for (uVar1 = 0; uVar1 < this->m_numThreads; uVar1 = uVar1 + 1) {
    std::__cxx11::to_string(__return_storage_ptr__,(int)uVar1);
    std::make_shared<Worker,std::__cxx11::string>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
    std::vector<std::shared_ptr<Worker>,std::allocator<std::shared_ptr<Worker>>>::
    emplace_back<std::shared_ptr<Worker>>
              ((vector<std::shared_ptr<Worker>,std::allocator<std::shared_ptr<Worker>>> *)
               &this->m_workers,(shared_ptr<Worker> *)local_60);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_60 + 8));
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
    local_60._24_8_ = 0;
    local_60._16_4_ = (int)uVar1;
    std::
    _Hashtable<int,std::pair<int_const,unsigned_long>,std::allocator<std::pair<int_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::_M_emplace<std::pair<int_const,unsigned_long>>
              ((_Hashtable<int,std::pair<int_const,unsigned_long>,std::allocator<std::pair<int_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)&this->m_stats,__return_storage_ptr__);
  }
  return;
}

Assistant:

void KeySequentialExecutor::startWorkers()
{
    //std::cout << "Going to start workers : " << m_numThreads << std::endl;
    for(int i = 0; i < m_numThreads; ++i)
    {
        m_workers.push_back(std::make_shared<Worker>(std::to_string(i)));
        m_stats.insert({i, 0});
    }
}